

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

List * copy_list(List *ls)

{
  List *pLVar1;
  List *new;
  List *ls_local;
  
  if (ls == (List *)0x0) {
    ls_local = (List *)0x0;
  }
  else {
    ls_local = alloc_list();
    memcpy(ls_local,ls,0x30);
    pLVar1 = copy_list(ls->car);
    ls_local->car = pLVar1;
    pLVar1 = copy_list(ls->cdr);
    ls_local->cdr = pLVar1;
  }
  return ls_local;
}

Assistant:

List *
copy_list (const List *ls)
{
  List *new;

  if (ls == NULL)
    return NULL;

  new = alloc_list ();
  *new = *ls;
  new->car = copy_list (ls->car);
  new->cdr = copy_list (ls->cdr);

  return new;
}